

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50 = 0x978bd0
  ;
  *(undefined8 *)&(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x38 = 0x978c48;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.AmbientIntensity.ptr =
       4.90694537126543e-317;
  this[-1].super_IfcLightSourcePositional.super_IfcLightSource.Intensity.ptr = 4.90696513389126e-317
  ;
  puVar1 = *(undefined1 **)&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x80;
  puVar2 = &this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x90;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50,0x108);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}